

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O2

void duckdb::InSearchPathFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  undefined8 uVar3;
  UnifiedVectorFormat *pUVar4;
  undefined8 *puVar5;
  long lVar6;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  UnifiedVectorFormat UVar7;
  bool bVar8;
  ClientContext *pCVar9;
  long lVar10;
  BinaryLambdaWrapper *this;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar11;
  Vector *pVVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  VectorType VVar17;
  UnifiedVectorFormat *pUVar18;
  idx_t iVar19;
  idx_t i;
  idx_t i_2;
  undefined8 *puVar20;
  ulong uVar21;
  UnifiedVectorFormat *pUVar22;
  anon_class_16_2_9a274d3c fun;
  anon_class_16_2_9a274d3c fun_00;
  anon_class_16_2_9a274d3c fun_01;
  anon_class_16_2_9a274d3c fun_02;
  anon_class_16_2_9a274d3c fun_03;
  anon_class_16_2_9a274d3c fun_04;
  anon_class_16_2_9a274d3c fun_05;
  anon_class_16_2_9a274d3c fun_06;
  anon_class_16_2_9a274d3c fun_07;
  anon_class_16_2_9a274d3c fun_08;
  anon_class_16_2_9a274d3c fun_09;
  anon_class_16_2_9a274d3c fun_10;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  undefined8 in_stack_fffffffffffffef8;
  Vector *pVVar23;
  TemplatedValidityMask<unsigned_long> *this_00;
  idx_t in_stack_ffffffffffffff08;
  idx_t idx;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  
  pCVar9 = (ClientContext *)duckdb::ExpressionState::GetContext();
  lVar10 = duckdb::ClientData::Get(pCVar9);
  this = (BinaryLambdaWrapper *)(lVar10 + 0x78);
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar17 = (VectorType)result;
  pVVar12 = result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar17);
    uVar3 = *(undefined8 *)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      right_01.value.pointer.ptr = (char *)pVVar12;
      right_01.value._0_8_ = in_stack_fffffffffffffef8;
      fun_01.context = (ClientContext *)**(undefined8 **)(vector + 0x20);
      fun_01.search_path =
           (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
            *)pCVar9;
      left_01.value.pointer.ptr = (char *)**(undefined8 **)(vector_00 + 0x20);
      left_01.value._0_8_ = (*(undefined8 **)(vector + 0x20))[1];
      bVar8 = BinaryLambdaWrapper::
              Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                        (this,fun_01,left_01,right_01,
                         (ValidityMask *)(*(undefined8 **)(vector_00 + 0x20))[1],
                         in_stack_ffffffffffffff08);
      *(bool *)uVar3 = bVar8;
      return;
    }
  }
  else {
    pUVar4 = *(UnifiedVectorFormat **)(input + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar10 = *(long *)(vector + 0x20);
      puVar5 = *(undefined8 **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar17);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          puVar20 = (undefined8 *)(lVar10 + 8);
          for (pUVar18 = (UnifiedVectorFormat *)0x0; pUVar4 != pUVar18; pUVar18 = pUVar18 + 1) {
            right_05.value.pointer.ptr = (char *)pVVar12;
            right_05.value._0_8_ = in_stack_fffffffffffffef8;
            fun_05.context = (ClientContext *)puVar20[-1];
            fun_05.search_path =
                 (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                  *)pCVar9;
            left_05.value.pointer.ptr = (char *)*puVar5;
            left_05.value._0_8_ = *puVar20;
            UVar7 = (UnifiedVectorFormat)
                    BinaryLambdaWrapper::
                    Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                              (this,fun_05,left_05,right_05,(ValidityMask *)puVar5[1],(idx_t)puVar20
                              );
            pUVar18[lVar6] = UVar7;
            puVar20 = puVar20 + 2;
          }
          return;
        }
        iVar19 = lVar10 + 8;
        uVar13 = 0;
        pUVar18 = (UnifiedVectorFormat *)0x0;
        pVVar23 = pVVar12;
        do {
          if (uVar13 == (ulong)(pUVar4 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(pVVar12 + 0x28) == 0) {
            pUVar11 = pUVar18 + 0x40;
            if (pUVar4 <= pUVar18 + 0x40) {
              pUVar11 = pUVar4;
            }
LAB_0070e6a4:
            puVar20 = (undefined8 *)((long)pUVar18 * 0x10 + iVar19);
            pVVar12 = pVVar23;
            for (; pUVar22 = pUVar18, pVVar23 = pVVar12, pUVar18 < pUVar11; pUVar18 = pUVar18 + 1) {
              right_00.value.pointer.ptr = (char *)pVVar12;
              right_00.value._0_8_ = in_stack_fffffffffffffef8;
              fun_00.context = (ClientContext *)puVar20[-1];
              fun_00.search_path =
                   (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                    *)pCVar9;
              left_00.value.pointer.ptr = (char *)*puVar5;
              left_00.value._0_8_ = *puVar20;
              UVar7 = (UnifiedVectorFormat)
                      BinaryLambdaWrapper::
                      Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                (this,fun_00,left_00,right_00,(ValidityMask *)puVar5[1],iVar19);
              pUVar18[lVar6] = UVar7;
              puVar20 = puVar20 + 2;
            }
          }
          else {
            uVar15 = *(ulong *)(*(long *)(pVVar12 + 0x28) + uVar13 * 8);
            pUVar11 = pUVar18 + 0x40;
            if (pUVar4 <= pUVar18 + 0x40) {
              pUVar11 = pUVar4;
            }
            if (uVar15 == 0xffffffffffffffff) goto LAB_0070e6a4;
            pUVar22 = pUVar11;
            if (uVar15 != 0) {
              puVar20 = (undefined8 *)((long)pUVar18 * 0x10 + iVar19);
              uVar14 = 0;
              pVVar12 = pVVar23;
              for (; pUVar22 = pUVar18, pVVar23 = pVVar12, pUVar18 < pUVar11; pUVar18 = pUVar18 + 1)
              {
                if ((uVar15 >> (uVar14 & 0x3f) & 1) != 0) {
                  right.value.pointer.ptr = (char *)pVVar12;
                  right.value._0_8_ = in_stack_fffffffffffffef8;
                  fun.context = (ClientContext *)puVar20[-1];
                  fun.search_path =
                       (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                        *)pCVar9;
                  left.value.pointer.ptr = (char *)*puVar5;
                  left.value._0_8_ = *puVar20;
                  UVar7 = (UnifiedVectorFormat)
                          BinaryLambdaWrapper::
                          Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                    (this,fun,left,right,(ValidityMask *)puVar5[1],iVar19);
                  pUVar18[lVar6] = UVar7;
                }
                puVar20 = puVar20 + 2;
                uVar14 = uVar14 + 1;
              }
            }
          }
          pUVar18 = pUVar22;
          uVar13 = uVar13 + 1;
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          iVar19 = *(idx_t *)(vector + 0x20);
          lVar10 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar17);
          lVar6 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            lVar16 = 8;
            for (pUVar18 = (UnifiedVectorFormat *)0x0; pUVar4 != pUVar18; pUVar18 = pUVar18 + 1) {
              right_10.value.pointer.ptr = (char *)pVVar12;
              right_10.value._0_8_ = in_stack_fffffffffffffef8;
              fun_10.context = *(ClientContext **)((iVar19 - 8) + lVar16);
              fun_10.search_path =
                   (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                    *)pCVar9;
              left_10.value.pointer.ptr = (char *)*(undefined8 *)(lVar10 + -8 + lVar16);
              left_10.value._0_8_ = *(undefined8 *)(iVar19 + lVar16);
              UVar7 = (UnifiedVectorFormat)
                      BinaryLambdaWrapper::
                      Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                (this,fun_10,left_10,right_10,*(ValidityMask **)(lVar10 + lVar16),
                                 in_stack_ffffffffffffff08);
              pUVar18[lVar6] = UVar7;
              lVar16 = lVar16 + 0x10;
            }
          }
          else {
            pUVar18 = (UnifiedVectorFormat *)0x0;
            idx = iVar19;
            for (uVar13 = 0; uVar13 != (ulong)(pUVar4 + 0x3f) >> 6; uVar13 = uVar13 + 1) {
              lVar16 = *(long *)(result + 0x28);
              if (lVar16 == 0) {
                pUVar11 = pUVar18 + 0x40;
                if (pUVar4 <= pUVar18 + 0x40) {
                  pUVar11 = pUVar4;
                }
LAB_0070eb7c:
                uVar15 = (long)pUVar18 << 4 | 8;
                for (pUVar22 = pUVar18; pUVar22 < pUVar11; pUVar22 = pUVar22 + 1) {
                  right_07.value.pointer.ptr = (char *)uVar13;
                  right_07.value._0_8_ = in_stack_fffffffffffffef8;
                  fun_07.context = *(ClientContext **)((iVar19 - 8) + uVar15);
                  fun_07.search_path =
                       (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                        *)pCVar9;
                  left_07.value.pointer.ptr = (char *)*(undefined8 *)(lVar10 + -8 + uVar15);
                  left_07.value._0_8_ = *(undefined8 *)(iVar19 + uVar15);
                  UVar7 = (UnifiedVectorFormat)
                          BinaryLambdaWrapper::
                          Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                    (this,fun_07,left_07,right_07,
                                     *(ValidityMask **)(lVar10 + uVar15),idx);
                  pUVar22[lVar6] = UVar7;
                  uVar15 = uVar15 + 0x10;
                }
              }
              else {
                uVar15 = *(ulong *)(lVar16 + uVar13 * 8);
                pUVar11 = pUVar18 + 0x40;
                if (pUVar4 <= pUVar18 + 0x40) {
                  pUVar11 = pUVar4;
                }
                if (uVar15 == 0xffffffffffffffff) goto LAB_0070eb7c;
                pUVar22 = pUVar11;
                if (uVar15 != 0) {
                  uVar21 = (long)pUVar18 << 4 | 8;
                  uVar14 = 0;
                  iVar19 = idx;
                  for (pUVar22 = pUVar18; idx = iVar19, pUVar22 < pUVar11; pUVar22 = pUVar22 + 1) {
                    if ((uVar15 >> (uVar14 & 0x3f) & 1) != 0) {
                      right_06.value.pointer.ptr = (char *)uVar13;
                      right_06.value._0_8_ = in_stack_fffffffffffffef8;
                      fun_06.context = *(ClientContext **)((iVar19 - 8) + uVar21);
                      fun_06.search_path =
                           (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                            *)pCVar9;
                      left_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar10 + -8 + uVar21);
                      left_06.value._0_8_ = *(undefined8 *)(iVar19 + uVar21);
                      UVar7 = (UnifiedVectorFormat)
                              BinaryLambdaWrapper::
                              Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                        (this,fun_06,left_06,right_06,
                                         *(ValidityMask **)(lVar10 + uVar21),iVar19);
                      pUVar22[lVar6] = UVar7;
                    }
                    uVar21 = uVar21 + 0x10;
                    uVar14 = uVar14 + 1;
                  }
                }
              }
              pUVar18 = pUVar22;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar4);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar4);
          duckdb::Vector::SetVectorType((VectorType)result);
          lVar10 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            for (pUVar18 = (UnifiedVectorFormat *)0x0; pUVar4 != pUVar18; pUVar18 = pUVar18 + 1) {
              pUVar11 = pUVar18;
              if (*_ldata != 0) {
                pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar18 * 4);
              }
              pUVar22 = pUVar18;
              if (*local_c0 != 0) {
                pUVar22 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar18 * 4);
              }
              right_02.value.pointer.ptr = (char *)result;
              right_02.value._0_8_ = in_stack_fffffffffffffef8;
              fun_02.context = *(ClientContext **)(local_70 + (long)pUVar11 * 0x10);
              fun_02.search_path =
                   (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                    *)pCVar9;
              left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar22 * 0x10);
              left_02.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar11 * 0x10);
              UVar7 = (UnifiedVectorFormat)
                      BinaryLambdaWrapper::
                      Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                (this,fun_02,left_02,right_02,
                                 *(ValidityMask **)(local_b8 + 8 + (long)pUVar22 * 0x10),
                                 in_stack_ffffffffffffff08);
              pUVar18[lVar10] = UVar7;
            }
          }
          else {
            this_00 = (TemplatedValidityMask<unsigned_long> *)(result + 0x28);
            for (pUVar18 = (UnifiedVectorFormat *)0x0; pUVar4 != pUVar18; pUVar18 = pUVar18 + 1) {
              pUVar11 = pUVar18;
              if (*_ldata != 0) {
                pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar18 * 4);
              }
              pUVar22 = pUVar18;
              if (*local_c0 != 0) {
                pUVar22 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar18 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar11 >> 6) * 8) >> ((ulong)pUVar11 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar22 >> 6) * 8) >> ((ulong)pUVar22 & 0x3f) & 1)
                   != 0)))) {
                right_08.value.pointer.ptr = (char *)this_00;
                right_08.value._0_8_ = in_stack_fffffffffffffef8;
                fun_08.context = *(ClientContext **)(local_70 + (long)pUVar11 * 0x10);
                fun_08.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)pCVar9;
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar22 * 0x10)
                ;
                left_08.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar11 * 0x10);
                UVar7 = (UnifiedVectorFormat)
                        BinaryLambdaWrapper::
                        Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                  (this,fun_08,left_08,right_08,
                                   *(ValidityMask **)(local_b8 + 8 + (long)pUVar22 * 0x10),
                                   in_stack_ffffffffffffff08);
                pUVar18[lVar10] = UVar7;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid(this_00,(idx_t)pUVar18);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      puVar5 = *(undefined8 **)(vector + 0x20);
      lVar10 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar17);
        lVar6 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,(ValidityMask *)(vector_00 + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          puVar20 = (undefined8 *)(lVar10 + 8);
          for (pUVar18 = (UnifiedVectorFormat *)0x0; pUVar4 != pUVar18; pUVar18 = pUVar18 + 1) {
            right_09.value.pointer.ptr = (char *)pVVar12;
            right_09.value._0_8_ = in_stack_fffffffffffffef8;
            fun_09.context = (ClientContext *)*puVar5;
            fun_09.search_path =
                 (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                  *)pCVar9;
            left_09.value.pointer.ptr = (char *)puVar20[-1];
            left_09.value._0_8_ = puVar5[1];
            UVar7 = (UnifiedVectorFormat)
                    BinaryLambdaWrapper::
                    Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                              (this,fun_09,left_09,right_09,(ValidityMask *)*puVar20,(idx_t)puVar20)
            ;
            pUVar18[lVar6] = UVar7;
            puVar20 = puVar20 + 2;
          }
          return;
        }
        iVar19 = lVar10 + 8;
        uVar13 = 0;
        pUVar18 = (UnifiedVectorFormat *)0x0;
        pVVar23 = pVVar12;
        do {
          if (uVar13 == (ulong)(pUVar4 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(pVVar12 + 0x28) == 0) {
            pUVar11 = pUVar18 + 0x40;
            if (pUVar4 <= pUVar18 + 0x40) {
              pUVar11 = pUVar4;
            }
LAB_0070e990:
            puVar20 = (undefined8 *)((long)pUVar18 * 0x10 + iVar19);
            pVVar12 = pVVar23;
            for (pUVar22 = pUVar18; pVVar23 = pVVar12, pUVar22 < pUVar11; pUVar22 = pUVar22 + 1) {
              right_04.value.pointer.ptr = (char *)pVVar12;
              right_04.value._0_8_ = in_stack_fffffffffffffef8;
              fun_04.context = (ClientContext *)*puVar5;
              fun_04.search_path =
                   (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                    *)pCVar9;
              left_04.value.pointer.ptr = (char *)puVar20[-1];
              left_04.value._0_8_ = puVar5[1];
              UVar7 = (UnifiedVectorFormat)
                      BinaryLambdaWrapper::
                      Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                (this,fun_04,left_04,right_04,(ValidityMask *)*puVar20,iVar19);
              pUVar22[lVar6] = UVar7;
              puVar20 = puVar20 + 2;
            }
          }
          else {
            uVar15 = *(ulong *)(*(long *)(pVVar12 + 0x28) + uVar13 * 8);
            pUVar11 = pUVar18 + 0x40;
            if (pUVar4 <= pUVar18 + 0x40) {
              pUVar11 = pUVar4;
            }
            if (uVar15 == 0xffffffffffffffff) goto LAB_0070e990;
            pUVar22 = pUVar11;
            if (uVar15 != 0) {
              puVar20 = (undefined8 *)((long)pUVar18 * 0x10 + iVar19);
              uVar14 = 0;
              pVVar12 = pVVar23;
              for (pUVar22 = pUVar18; pVVar23 = pVVar12, pUVar22 < pUVar11; pUVar22 = pUVar22 + 1) {
                if ((uVar15 >> (uVar14 & 0x3f) & 1) != 0) {
                  right_03.value.pointer.ptr = (char *)pVVar12;
                  right_03.value._0_8_ = in_stack_fffffffffffffef8;
                  fun_03.context = (ClientContext *)*puVar5;
                  fun_03.search_path =
                       (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                        *)pCVar9;
                  left_03.value.pointer.ptr = (char *)puVar20[-1];
                  left_03.value._0_8_ = puVar5[1];
                  UVar7 = (UnifiedVectorFormat)
                          BinaryLambdaWrapper::
                          Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                    (this,fun_03,left_03,right_03,(ValidityMask *)*puVar20,iVar19);
                  pUVar22[lVar6] = UVar7;
                }
                puVar20 = puVar20 + 2;
                uVar14 = uVar14 + 1;
              }
            }
          }
          uVar13 = uVar13 + 1;
          pUVar18 = pUVar22;
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar17);
  }
  duckdb::ConstantVector::SetNull(pVVar12,true);
  return;
}

Assistant:

static void InSearchPathFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &context = state.GetContext();
	auto &search_path = ClientData::Get(context).catalog_search_path;
	BinaryExecutor::Execute<string_t, string_t, bool>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t db_name, string_t schema_name) {
		    return search_path->SchemaInSearchPath(context, db_name.GetString(), schema_name.GetString());
	    });
}